

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O3

mcsseg mcsout(mcscxdef *ctx,uint objid,uchar *ptr,ushort siz,mcsseg oldseg,int dirty)

{
  ushort uVar1;
  ushort uVar2;
  mcsdsdef **ppmVar3;
  mcsdsdef *pmVar4;
  uint uVar5;
  mcsdsdef **ppmVar6;
  uint uVar7;
  ulong uVar8;
  undefined6 in_register_00000082;
  ushort *puVar9;
  uint uVar10;
  ushort unaff_R14W;
  bool bVar11;
  
  if ((int)CONCAT62(in_register_00000082,oldseg) == 0xffff) {
    ppmVar3 = ctx->mcscxtab;
  }
  else {
    ppmVar3 = ctx->mcscxtab;
    uVar8 = (ulong)oldseg & 0xff;
    pmVar4 = ppmVar3[oldseg >> 8];
    if (((((pmVar4[uVar8].mcsdsflg & 1) == 0) && (pmVar4[uVar8].mcsdsobj == objid)) && (dirty == 0))
       && (siz <= pmVar4[uVar8].mcsdssiz)) {
      pmVar4[uVar8].mcsdsflg = pmVar4[uVar8].mcsdsflg | 1;
      return oldseg;
    }
  }
  uVar1 = ctx->mcscxmsg;
  if (uVar1 != 0) {
    uVar5 = 0;
    uVar8 = 0xffff;
    ppmVar6 = ppmVar3;
    uVar7 = 0;
    do {
      if (*ppmVar6 == (mcsdsdef *)0x0) break;
      if ((ushort)uVar5 < uVar1) {
        puVar9 = &(*ppmVar6)->mcsdsflg;
        uVar10 = 0;
        do {
          if (((((*puVar9 & 1) == 0) && (uVar2 = puVar9[-4], siz <= uVar2)) &&
              (((short)uVar8 == -1 || (uVar2 < unaff_R14W)))) &&
             (uVar8 = (ulong)uVar5, unaff_R14W = uVar2, uVar2 == siz)) {
            uVar8 = (ulong)uVar5;
            unaff_R14W = siz;
            break;
          }
          uVar5 = uVar5 + 1;
          if (uVar1 <= (ushort)uVar5) break;
          puVar9 = puVar9 + 0xc;
          bVar11 = uVar10 < 0xff;
          uVar10 = uVar10 + 1;
        } while (bVar11);
      }
      if (((short)uVar8 != -1) && (unaff_R14W == siz)) goto LAB_00215a17;
      if (uVar1 <= (ushort)uVar5) break;
      ppmVar6 = ppmVar6 + 1;
      bVar11 = uVar7 < 0xff;
      uVar7 = uVar7 + 1;
    } while (bVar11);
    if ((short)uVar8 != -1) {
LAB_00215a17:
      pmVar4 = ppmVar3[(uVar8 & 0xffff) >> 8] + (uVar8 & 0xff);
      pmVar4->mcsdsobj = objid;
      mcswrt(ctx,pmVar4,ptr,siz);
      *(byte *)&pmVar4->mcsdsflg = (byte)pmVar4->mcsdsflg | 1;
      return (mcsseg)uVar8;
    }
  }
  uVar8 = (ulong)siz;
  if (ctx->mcscxmax < uVar8) {
    mcscompact(ctx);
    if (ctx->mcscxmax < uVar8) {
      errsigf(ctx->mcscxerr,"TADS",6);
    }
    uVar1 = ctx->mcscxmsg;
    ppmVar3 = ctx->mcscxtab;
  }
  uVar2 = uVar1 >> 8;
  pmVar4 = ppmVar3[uVar2];
  if (pmVar4 == (mcsdsdef *)0x0) {
    pmVar4 = (mcsdsdef *)mchalo(ctx->mcscxerr,0x1800,"mcsout");
    ctx->mcscxtab[uVar2] = pmVar4;
    pmVar4 = ctx->mcscxtab[uVar2];
  }
  pmVar4 = pmVar4 + ((ulong)uVar1 & 0xff);
  pmVar4->mcsdsptr = ctx->mcscxtop;
  pmVar4->mcsdssiz = siz;
  pmVar4->mcsdsobj = objid;
  mcswrt(ctx,pmVar4,ptr,siz);
  pmVar4->mcsdsflg = 1;
  ctx->mcscxtop = ctx->mcscxtop + uVar8;
  ctx->mcscxmax = ctx->mcscxmax - uVar8;
  ctx->mcscxmsg = ctx->mcscxmsg + 1;
  return uVar1;
}

Assistant:

mcsseg mcsout(mcscxdef *ctx, uint objid, uchar *ptr, ushort siz,
              mcsseg oldseg, int dirty)
{
    mcsdsdef  *desc;
    mcsdsdef **pagep;
    uint       i;
    uint       j;
    mcsseg     min;
    mcsseg     cur;
    ushort     minsiz;
    
    IF_DEBUG(printf("<< mcsout: objid=%d, ptr=%lx, siz=%u, oldseg=%u >>\n",
                    objid, (unsigned long)ptr, siz, oldseg));
    
    /* see if old segment can be reused */
    if (oldseg != MCSSEGINV)
    {
        desc = mcsdsc(ctx, oldseg);
        if (!(desc->mcsdsflg & MCSDSFINUSE)     /* if old seg is not in use */
            && desc->mcsdsobj == objid            /* and it has same object */
            && desc->mcsdssiz >= siz           /* and it's still big enough */
            && !dirty)      /* and the object in memory hasn't been changed */
        {
            /* we can reuse the old segment without rewriting it */
            desc->mcsdsflg |= MCSDSFINUSE;        /* mark segment as in use */
            return(oldseg);
        }
    }
    
    /* look for the smallest unused segment big enough for this object */
    for (cur = 0, min = MCSSEGINV, i = 0, pagep = ctx->mcscxtab
         ; cur < ctx->mcscxmsg && i < MCSPAGETAB && *pagep ; ++pagep, ++i)
    {
        for (j = 0, desc = *pagep ; cur < ctx->mcscxmsg && j < MCSPAGECNT
             ; ++desc, ++j, ++cur)
        {
            if (!(desc->mcsdsflg & MCSDSFINUSE)
                && desc->mcsdssiz >= siz
                && (min == MCSSEGINV || desc->mcsdssiz < minsiz))
            {
                min = cur;
                minsiz = desc->mcsdssiz;
                if (minsiz == siz) break;       /* exact match - we're done */
            }
        }
        /* quit if we found an exact match */
        if (min != MCSSEGINV && minsiz == siz) break;
    }
    
    /* if we found nothing, allocate a new segment if possible */
    if (min == MCSSEGINV)
    {
        if (siz > ctx->mcscxmax)
        {
            /* swap file is too big; compact it and try again */
            mcscompact(ctx);
            if (siz > ctx->mcscxmax)
                errsig(ctx->mcscxerr, ERR_SWAPBIG);
        }
            
        min = ctx->mcscxmsg;
        if ((min >> 8) >= MCSPAGETAB)      /* exceeded pages in page table? */
            errsig(ctx->mcscxerr, ERR_SWAPPG);
        
        if (!ctx->mcscxtab[min >> 8])         /* haven't allocate page yet? */
        {
            ctx->mcscxtab[min >> 8] = 
                (mcsdsdef *)mchalo(ctx->mcscxerr,
                                   (MCSPAGECNT * sizeof(mcsdsdef)),
                                   "mcsout");
        }

        /* set up new descriptor */
        desc = mcsdsc(ctx, min);
        desc->mcsdsptr = ctx->mcscxtop;
        desc->mcsdssiz = siz;
        desc->mcsdsobj = objid;

        /* write out the segment */
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg = MCSDSFINUSE;

        /* update context information to account for new segment */
        ctx->mcscxtop += siz;             /* add to top seek offset in file */
        ctx->mcscxmax -= siz;                     /* take size out of quota */
        ctx->mcscxmsg++;                /* increment last segment allocated */
        
        return(min);
    }
    else
    {
        desc = mcsdsc(ctx, min);
        desc->mcsdsobj = objid;
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg |= MCSDSFINUSE;

        return(min);
    }
}